

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::computeQuadTexCoord2DArray
               (vector<float,_std::allocator<float>_> *dst,int layerNdx,Vec2 *bottomLeft,
               Vec2 *topRight)

{
  float *pfVar1;
  float fVar2;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = bottomLeft->m_data[0];
  pfVar1[1] = bottomLeft->m_data[1];
  fVar2 = (float)layerNdx;
  pfVar1[2] = fVar2;
  pfVar1[3] = bottomLeft->m_data[0];
  pfVar1[4] = topRight->m_data[1];
  pfVar1[5] = fVar2;
  pfVar1[6] = topRight->m_data[0];
  pfVar1[7] = bottomLeft->m_data[1];
  pfVar1[8] = fVar2;
  pfVar1[9] = topRight->m_data[0];
  pfVar1[10] = topRight->m_data[1];
  pfVar1[0xb] = fVar2;
  return;
}

Assistant:

void computeQuadTexCoord2DArray (std::vector<float>& dst, int layerNdx, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	dst.resize(4*3);

	dst[0] = bottomLeft.x();	dst[ 1] = bottomLeft.y();	dst[ 2] = (float)layerNdx;
	dst[3] = bottomLeft.x();	dst[ 4] = topRight.y();		dst[ 5] = (float)layerNdx;
	dst[6] = topRight.x();		dst[ 7] = bottomLeft.y();	dst[ 8] = (float)layerNdx;
	dst[9] = topRight.x();		dst[10] = topRight.y();		dst[11] = (float)layerNdx;
}